

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O0

CURLcode curl_mime_name(curl_mimepart *part,char *name)

{
  char *pcVar1;
  char *name_local;
  curl_mimepart *part_local;
  
  if (part == (curl_mimepart *)0x0) {
    part_local._4_4_ = CURLE_BAD_FUNCTION_ARGUMENT;
  }
  else {
    (*Curl_cfree)(part->name);
    part->name = (char *)0x0;
    part->name = (char *)0x0;
    if (name != (char *)0x0) {
      pcVar1 = (*Curl_cstrdup)(name);
      part->name = pcVar1;
      if (part->name == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
    }
    part_local._4_4_ = CURLE_OK;
  }
  return part_local._4_4_;
}

Assistant:

CURLcode curl_mime_name(curl_mimepart *part, const char *name)
{
  if(!part)
    return CURLE_BAD_FUNCTION_ARGUMENT;

  Curl_safefree(part->name);
  part->name = NULL;

  if(name) {
    part->name = strdup(name);
    if(!part->name)
      return CURLE_OUT_OF_MEMORY;
  }

  return CURLE_OK;
}